

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::encode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Builder output_00;
  Field field_00;
  Field field_01;
  undefined8 this_00;
  bool bVar1;
  uint uVar2;
  Iterator IVar3;
  Type type;
  Reader local_200;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 auStack_178 [8];
  Builder item;
  Fault local_140;
  Fault f;
  uint local_130;
  DebugExpression<unsigned_int> local_12c;
  undefined1 local_128 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  Field field;
  undefined1 local_b8 [8];
  Iterator __end3;
  undefined1 local_98 [8];
  Iterator __begin3;
  FieldList *__range3;
  Builder items;
  undefined1 local_50 [8];
  FieldList fields;
  JsonCodec *codec_local;
  TestDynamicStructHandler *this_local;
  
  fields.list.reader._40_8_ = codec;
  items.builder._32_8_ = DynamicStruct::Reader::getSchema(&input);
  StructSchema::getFields((FieldList *)local_50,(StructSchema *)&items.builder.structDataSize);
  uVar2 = StructSchema::FieldList::size((FieldList *)local_50);
  capnp::json::Value::Builder::initArray((Builder *)&__range3,&output,uVar2);
  __begin3._8_8_ = (FieldList *)local_50;
  IVar3 = StructSchema::FieldList::begin((FieldList *)local_50);
  __end3._8_8_ = IVar3.container;
  __begin3.container._0_4_ = IVar3.index;
  local_98 = (undefined1  [8])__end3._8_8_;
  IVar3 = StructSchema::FieldList::end((FieldList *)__begin3._8_8_);
  local_b8 = (undefined1  [8])IVar3.container;
  __end3.container._0_4_ = IVar3.index;
  while( true ) {
    bVar1 = IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_98,
                       (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)&_kjCondition.result,
               (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_98);
    local_130 = StructSchema::Field::getIndex((Field *)&_kjCondition.result);
    local_12c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
    f.exception._4_4_ =
         List<capnp::json::Value,_(capnp::Kind)3>::Builder::size((Builder *)&__range3);
    kj::_::DebugExpression<unsigned_int>::operator<
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_128,&local_12c,
               (uint *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
    if (!bVar1) break;
    uVar2 = StructSchema::Field::getIndex((Field *)&_kjCondition.result);
    List<capnp::json::Value,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)auStack_178,(Builder *)&__range3,uVar2);
    memcpy(&local_1b8,&_kjCondition.result,0x40);
    field_00._8_8_ = uStack_1b0;
    field_00.parent.super_Schema.raw = (Schema)(Schema)local_1b8;
    field_00.proto._reader.segment = (SegmentReader *)local_1a8;
    field_00.proto._reader.capTable = (CapTableReader *)uStack_1a0;
    field_00.proto._reader.data = (void *)local_198;
    field_00.proto._reader.pointers = (WirePointer *)uStack_190;
    field_00.proto._reader.dataSize = (undefined4)local_188;
    field_00.proto._reader.pointerCount = local_188._4_2_;
    field_00.proto._reader._38_2_ = local_188._6_2_;
    field_00.proto._reader._40_8_ = uStack_180;
    bVar1 = DynamicStruct::Reader::has(&input,field_00,NON_NULL);
    this_00 = fields.list.reader._40_8_;
    if (bVar1) {
      field_01._8_8_ = field.parent.super_Schema.raw;
      field_01.parent.super_Schema.raw = (Schema)(Schema)_kjCondition._24_8_;
      field_01.proto._reader.segment = (SegmentReader *)field._8_8_;
      field_01.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
      field_01.proto._reader.data = field.proto._reader.capTable;
      field_01.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
      field_01.proto._reader._32_8_ = field.proto._reader.pointers;
      field_01.proto._reader._40_8_ = field.proto._reader._32_8_;
      DynamicStruct::Reader::get(&local_200,&input,field_01);
      type = StructSchema::Field::getType((Field *)&_kjCondition.result);
      output_00._builder.capTable = (CapTableBuilder *)item._builder.segment;
      output_00._builder.segment = (SegmentBuilder *)auStack_178;
      output_00._builder.data = item._builder.capTable;
      output_00._builder.pointers = (WirePointer *)item._builder.data;
      output_00._builder._32_8_ = item._builder.pointers;
      JsonCodec::encode((JsonCodec *)this_00,&local_200,type,output_00);
      DynamicValue::Reader::~Reader(&local_200);
    }
    else {
      capnp::json::Value::Builder::setNull((Builder *)auStack_178);
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator++
              ((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_98);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
            (&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
             ,0x2da,FAILED,"field.getIndex() < items.size()","_kjCondition,",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_128);
  kj::_::Debug::Fault::fatal(&local_140);
}

Assistant:

void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
    auto fields = input.getSchema().getFields();
    auto items = output.initArray(fields.size());
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (input.has(field)) {
        codec.encode(input.get(field), field.getType(), item);
      } else {
        item.setNull();
      }
    }
  }